

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::ShaderApiTests::init(ShaderApiTests *this,EVP_PKEY_CTX *ctx)

{
  TestCaseGroup *pTVar1;
  CreateShaderCase *pCVar2;
  TestNode *pTVar3;
  CompileShaderCase *pCVar4;
  char *pcVar5;
  ShaderSourceReplaceCase *this_00;
  ShaderSourceSplitCase *this_01;
  TestCaseGroup *pTVar6;
  ProgramBinaryUniformResetCase *this_02;
  int iVar7;
  int iVar8;
  bool bVar9;
  allocator<char> local_175;
  int numSlices;
  TestCaseGroup *local_170;
  Context *local_168;
  string caseName;
  string caseDesc;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string shaderTypeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_4c;
  int local_48;
  deUint32 local_44;
  bool *local_40;
  bool *local_38;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"create_delete","glCreateShader() tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pCVar2 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"create_vertex_shader",
             "Create vertex shader object",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar2);
  pCVar2 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"create_fragment_shader",
             "Create fragment shader object",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar2);
  pTVar3 = (TestNode *)operator_new(0xa8);
  DeleteShaderCase::DeleteShaderCase
            ((DeleteShaderCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "delete_vertex_fragment","Delete vertex shader and fragment shader");
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"compile_link","Compile and link tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pCVar4 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"compile_vertex_shader",
             "Compile vertex shader",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar4);
  pCVar4 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"compile_fragment_shader",
             "Compile fragment shader",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pCVar4);
  pTVar3 = (TestNode *)operator_new(0xa8);
  LinkVertexFragmentCase::LinkVertexFragmentCase
            ((LinkVertexFragmentCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "link_vertex_fragment","Link vertex and fragment shaders");
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"shader_source","glShaderSource() tests");
  local_170 = pTVar1;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  iVar8 = 2;
  while( true ) {
    bVar9 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar9) break;
    pcVar5 = glu::getShaderTypeName((uint)(iVar8 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseDesc,"replace_source_",(allocator<char> *)&local_b0);
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Replace source code of ",(allocator<char> *)&local_90);
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = (ShaderSourceReplaceCase *)operator_new(0xa0);
    ShaderSourceReplaceCase::ShaderSourceReplaceCase
              (this_00,(this->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar8 == 0));
    tcu::TestNode::addChild((TestNode *)local_170,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
  }
  iVar8 = 0;
  while (iVar8 != 3) {
    bVar9 = iVar8 != 0;
    local_168 = (Context *)0x180826b;
    if (bVar9) {
      local_168 = (Context *)0x180825a;
    }
    local_40 = glcts::fixed_sample_locations_values + 1;
    local_38 = glcts::fixed_sample_locations_values + 1;
    if (bVar9) {
      local_38 = (bool *)0x180829f;
    }
    local_44 = (uint)bVar9 + (uint)(iVar8 == 2) * 2;
    if (iVar8 == 2) {
      local_168 = (Context *)0x1808242;
      local_40 = (bool *)0x18082cb;
    }
    iVar7 = 1;
    local_4c = iVar8;
    while (iVar7 != 4) {
      local_48 = iVar7;
      iVar8 = 2;
      while( true ) {
        if (iVar8 == 0) break;
        numSlices = 1 << ((byte)iVar7 & 0x1f);
        de::toString<int>(&local_b0,&numSlices);
        std::operator+(&caseDesc,"split_source_",&local_b0);
        std::operator+(&caseName,&caseDesc,(char *)local_168);
        pcVar5 = "_vertex";
        if (iVar8 == 1) {
          pcVar5 = "_fragment";
        }
        std::operator+(&shaderTypeName,&caseName,pcVar5);
        std::__cxx11::string::~string((string *)&caseName);
        std::__cxx11::string::~string((string *)&caseDesc);
        std::__cxx11::string::~string((string *)&local_b0);
        pcVar5 = "Vertex";
        if (iVar8 == 1) {
          pcVar5 = "Fragment";
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar5,&local_175);
        std::operator+(&local_90,&local_f0," shader source split into ");
        de::toString<int>(&local_110,&numSlices);
        std::operator+(&local_70,&local_90,&local_110);
        std::operator+(&local_b0,&local_70," pieces");
        std::operator+(&caseDesc,&local_b0,local_38);
        std::operator+(&caseName,&caseDesc,local_40);
        std::__cxx11::string::~string((string *)&caseDesc);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_f0);
        this_01 = (ShaderSourceSplitCase *)operator_new(0xb8);
        ShaderSourceSplitCase::ShaderSourceSplitCase
                  (this_01,(this->super_TestCaseGroup).m_context,shaderTypeName._M_dataplus._M_p,
                   caseName._M_dataplus._M_p,(uint)(iVar8 + -1 == 0),numSlices,local_44);
        tcu::TestNode::addChild((TestNode *)local_170,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)&caseName);
        std::__cxx11::string::~string((string *)&shaderTypeName);
        iVar8 = iVar8 + -1;
      }
      iVar7 = local_48 + 1;
    }
    iVar8 = local_4c + 1;
  }
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"program_state",
             "Program state persistence tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"detach_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"detach shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateDetachShaderCase::ProgramStateDetachShaderCase
              ((ProgramStateDetachShaderCase *)pTVar3,local_168,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"reattach_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"reattach shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateReattachShaderCase::ProgramStateReattachShaderCase
              ((ProgramStateReattachShaderCase *)pTVar3,local_168,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"delete_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"delete shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateDeleteShaderCase::ProgramStateDeleteShaderCase
              ((ProgramStateDeleteShaderCase *)pTVar3,local_168,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"replace_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"replace shader object",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateReplaceShaderCase::ProgramStateReplaceShaderCase
              ((ProgramStateReplaceShaderCase *)pTVar3,local_168,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"recompile_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"recompile shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateRecompileShaderCase::ProgramStateRecompileShaderCase
              ((ProgramStateRecompileShaderCase *)pTVar3,local_168,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"replace_source",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"replace shader source",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xb0);
    ProgramStateReplaceSourceCase::ProgramStateReplaceSourceCase
              ((ProgramStateReplaceSourceCase *)pTVar3,local_168,caseName._M_dataplus._M_p,
               caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar1,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"program_binary",
             "Program binary API tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(this->super_TestCaseGroup).m_context,"simple","Simple API tests");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar6);
  pTVar3 = (TestNode *)operator_new(0xa8);
  ProgramBinarySimpleCase::ProgramBinarySimpleCase
            ((ProgramBinarySimpleCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "get_program_binary_vertex_fragment","Get vertex and fragment shader program binary");
  tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
  this_02 = (ProgramBinaryUniformResetCase *)operator_new(0xb8);
  ProgramBinaryUniformResetCase::ProgramBinaryUniformResetCase
            (this_02,(this->super_TestCaseGroup).m_context,"uniform_reset_on_binary_load",
             "Verify uniform reset on successful load of program binary");
  tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)this_02);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(this->super_TestCaseGroup).m_context,"binary_persistence",
             "Program binary persistence tests");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar6);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"detach_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"detach shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xc0);
    ProgramBinaryPersistenceDetachShaderCase::ProgramBinaryPersistenceDetachShaderCase
              ((ProgramBinaryPersistenceDetachShaderCase *)pTVar3,local_168,
               caseName._M_dataplus._M_p,caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"reattach_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"reattach shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xc0);
    ProgramBinaryPersistenceReattachShaderCase::ProgramBinaryPersistenceReattachShaderCase
              ((ProgramBinaryPersistenceReattachShaderCase *)pTVar3,local_168,
               caseName._M_dataplus._M_p,caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"delete_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"delete shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xc0);
    ProgramBinaryPersistenceDeleteShaderCase::ProgramBinaryPersistenceDeleteShaderCase
              ((ProgramBinaryPersistenceDeleteShaderCase *)pTVar3,local_168,
               caseName._M_dataplus._M_p,caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"replace_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"replace shader object",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xc0);
    ProgramBinaryPersistenceReplaceShaderCase::ProgramBinaryPersistenceReplaceShaderCase
              ((ProgramBinaryPersistenceReplaceShaderCase *)pTVar3,local_168,
               caseName._M_dataplus._M_p,caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_168 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"recompile_shader",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"recompile shader",&local_175);
  iVar8 = 2;
  while( true ) {
    iVar7 = iVar8 + -1;
    if (iVar8 == 0) break;
    local_170 = (TestCaseGroup *)CONCAT44(local_170._4_4_,iVar7);
    pcVar5 = glu::getShaderTypeName((uint)(iVar7 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xc0);
    ProgramBinaryPersistenceRecompileShaderCase::ProgramBinaryPersistenceRecompileShaderCase
              ((ProgramBinaryPersistenceRecompileShaderCase *)pTVar3,local_168,
               caseName._M_dataplus._M_p,caseDesc._M_dataplus._M_p,(uint)(iVar7 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
    iVar8 = (int)local_170;
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  local_170 = (TestCaseGroup *)(this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"replace_source",(allocator<char> *)&numSlices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"replace shader source",&local_175);
  iVar8 = 2;
  while( true ) {
    bVar9 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar9) break;
    pcVar5 = glu::getShaderTypeName((uint)(iVar8 == 0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderTypeName,pcVar5,(allocator<char> *)&caseName);
    std::operator+(&caseDesc,&local_f0,"_");
    std::operator+(&caseName,&caseDesc,&shaderTypeName);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::operator+(&local_90,"Build program, ",&local_110);
    std::operator+(&local_70,&local_90,", for ");
    std::operator+(&local_b0,&local_70,&shaderTypeName);
    std::operator+(&caseDesc,&local_b0," shader.");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = (TestNode *)operator_new(0xc0);
    ProgramBinaryPersistenceReplaceSourceCase::ProgramBinaryPersistenceReplaceSourceCase
              ((ProgramBinaryPersistenceReplaceSourceCase *)pTVar3,(Context *)local_170,
               caseName._M_dataplus._M_p,caseDesc._M_dataplus._M_p,(uint)(iVar8 == 0));
    tcu::TestNode::addChild((TestNode *)pTVar6,pTVar3);
    std::__cxx11::string::~string((string *)&caseDesc);
    std::__cxx11::string::~string((string *)&caseName);
    std::__cxx11::string::~string((string *)&shaderTypeName);
  }
  std::__cxx11::string::~string((string *)&local_110);
  iVar8 = std::__cxx11::string::~string((string *)&local_f0);
  return iVar8;
}

Assistant:

void ShaderApiTests::init (void)
{
	// create and delete shaders
	{
		TestCaseGroup* createDeleteGroup = new TestCaseGroup(m_context, "create_delete", "glCreateShader() tests");
		addChild(createDeleteGroup);

		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_vertex_shader",		"Create vertex shader object",		glu::SHADERTYPE_VERTEX));
		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_fragment_shader",	"Create fragment shader object",	glu::SHADERTYPE_FRAGMENT));

		createDeleteGroup->addChild(new DeleteShaderCase(m_context,	"delete_vertex_fragment",	"Delete vertex shader and fragment shader"));
	}

	// compile and link
	{
		TestCaseGroup* compileLinkGroup = new TestCaseGroup(m_context, "compile_link", "Compile and link tests");
		addChild(compileLinkGroup);

		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_vertex_shader",	"Compile vertex shader",	glu::SHADERTYPE_VERTEX));
		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_fragment_shader",	"Compile fragment shader",	glu::SHADERTYPE_FRAGMENT));

		compileLinkGroup->addChild(new LinkVertexFragmentCase(m_context,	"link_vertex_fragment",	"Link vertex and fragment shaders"));
	}

	// shader source
	{
		TestCaseGroup* shaderSourceGroup = new TestCaseGroup(m_context, "shader_source", "glShaderSource() tests");
		addChild(shaderSourceGroup);

		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;
			const std::string		shaderTypeName	= getShaderTypeName(shaderType);

			const std::string		caseName		= std::string("replace_source_") + shaderTypeName;
			const std::string		caseDesc		= std::string("Replace source code of ") + shaderTypeName + " shader.";

			shaderSourceGroup->addChild(new ShaderSourceReplaceCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType));
		}

		for (int stringLengthsInt	= 0; stringLengthsInt < 3; stringLengthsInt++)
		for (int caseNdx = 1; caseNdx <= 3; caseNdx++)
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const int				numSlices		= 1 << caseNdx;
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const bool				explicitLengths	= (stringLengthsInt != 0);
			const bool				randomNullTerm	= (stringLengthsInt == 2);

			const deUint32			flags			= (explicitLengths	? CASE_EXPLICIT_SOURCE_LENGTHS	: 0)
													| (randomNullTerm	? CASE_RANDOM_NULL_TERMINATED	: 0);

			const std::string		caseName		= "split_source_"
													+ de::toString(numSlices)
													+ (randomNullTerm ? "_random_negative_length" : (explicitLengths ? "_specify_lengths" : "_null_terminated"))
													+ ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");

			const std::string		caseDesc		= std::string((shaderType == glu::SHADERTYPE_FRAGMENT) ? "Fragment" : "Vertex")
													+ " shader source split into "
													+ de::toString(numSlices)
													+ " pieces"
													+ (explicitLengths ? ", using explicitly specified string lengths" : "")
													+ (randomNullTerm ? " with random negative length values" : "");

			shaderSourceGroup->addChild(new ShaderSourceSplitCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType, numSlices, flags));
		}
	}

	// link status and infolog
	{
		TestCaseGroup* linkStatusGroup = new TestCaseGroup(m_context, "program_state", "Program state persistence tests");
		addChild(linkStatusGroup);

		addProgramStateCase<ProgramStateDetachShaderCase>		(linkStatusGroup,	m_context,	"detach_shader",	"detach shader");
		addProgramStateCase<ProgramStateReattachShaderCase>		(linkStatusGroup,	m_context,	"reattach_shader",	"reattach shader");
		addProgramStateCase<ProgramStateDeleteShaderCase>		(linkStatusGroup,	m_context,	"delete_shader",	"delete shader");
		addProgramStateCase<ProgramStateReplaceShaderCase>		(linkStatusGroup,	m_context,	"replace_shader",	"replace shader object");
		addProgramStateCase<ProgramStateRecompileShaderCase>	(linkStatusGroup,	m_context,	"recompile_shader",	"recompile shader");
		addProgramStateCase<ProgramStateReplaceSourceCase>		(linkStatusGroup,	m_context,	"replace_source",	"replace shader source");
	}

	// program binary
	{
		TestCaseGroup* programBinaryGroup = new TestCaseGroup(m_context, "program_binary", "Program binary API tests");
		addChild(programBinaryGroup);

		{
			TestCaseGroup* simpleCaseGroup = new TestCaseGroup(m_context, "simple", "Simple API tests");
			programBinaryGroup->addChild(simpleCaseGroup);

			simpleCaseGroup->addChild(new ProgramBinarySimpleCase		(m_context,	"get_program_binary_vertex_fragment",	"Get vertex and fragment shader program binary"));
			simpleCaseGroup->addChild(new ProgramBinaryUniformResetCase	(m_context,	"uniform_reset_on_binary_load",			"Verify uniform reset on successful load of program binary"));
		}

		{
			TestCaseGroup* binaryPersistenceGroup = new TestCaseGroup(m_context, "binary_persistence", "Program binary persistence tests");
			programBinaryGroup->addChild(binaryPersistenceGroup);

			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceDetachShaderCase>		(binaryPersistenceGroup,	m_context,	"detach_shader",	"detach shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReattachShaderCase>		(binaryPersistenceGroup,	m_context,	"reattach_shader",	"reattach shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceDeleteShaderCase>		(binaryPersistenceGroup,	m_context,	"delete_shader",	"delete shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReplaceShaderCase>		(binaryPersistenceGroup,	m_context,	"replace_shader",	"replace shader object");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceRecompileShaderCase>	(binaryPersistenceGroup,	m_context,	"recompile_shader",	"recompile shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReplaceSourceCase>		(binaryPersistenceGroup,	m_context,	"replace_source",	"replace shader source");
		}
	}
}